

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::
ArrayWithPreallocation<soul::ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>,_16UL>
::reserve(ArrayWithPreallocation<soul::ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>,_16UL>
          *this,size_t minSize)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  if (*(ulong *)(this + 0x10) < minSize) {
    uVar2 = minSize + 0xf & 0xfffffffffffffff0;
    if (0x10 < uVar2) {
      pvVar1 = operator_new__(uVar2 * 0x118);
      lVar3 = 0;
      for (uVar4 = 0; uVar4 < *(ulong *)(this + 8); uVar4 = uVar4 + 1) {
        ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::ArrayWithPreallocation
                  ((ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                    *)((long)pvVar1 + lVar3),
                   (ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                    *)(*(long *)this + lVar3));
        ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::clear((ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)(*(long *)this + lVar3));
        lVar3 = lVar3 + 0x118;
      }
      freeIfHeapAllocated(this);
      *(void **)this = pvVar1;
    }
    *(ulong *)(this + 0x10) = uVar2;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }